

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t match_list_unmatched_inclusions_next
                  (archive_match *a,match_list *list,wchar_t mbs,void **vp)

{
  wchar_t wVar1;
  int *piVar2;
  match *local_50;
  wchar_t *p_1;
  char *p;
  match *pmStack_38;
  wchar_t r;
  match *m;
  void **vp_local;
  match_list *pmStack_20;
  wchar_t mbs_local;
  match_list *list_local;
  archive_match *a_local;
  
  *vp = (void *)0x0;
  if (list->unmatched_eof == L'\0') {
    if (list->unmatched_next == (match *)0x0) {
      if (list->unmatched_count == L'\0') {
        return L'\x01';
      }
      list->unmatched_next = list->first;
    }
    for (pmStack_38 = list->unmatched_next; pmStack_38 != (match *)0x0;
        pmStack_38 = pmStack_38->next) {
      if (pmStack_38->matches == 0) {
        m = (match *)vp;
        vp_local._4_4_ = mbs;
        pmStack_20 = list;
        list_local = (match_list *)a;
        if (mbs == L'\0') {
          p._4_4_ = archive_mstring_get_wcs(&a->archive,&pmStack_38->pattern,(wchar_t **)&local_50);
          if ((p._4_4_ < L'\0') && (piVar2 = __errno_location(), *piVar2 == 0xc)) {
            wVar1 = error_nomem((archive_match *)list_local);
            return wVar1;
          }
          if (local_50 == (match *)0x0) {
            local_50 = (match *)(anon_var_dwarf_7d75d + 6);
          }
          m->next = local_50;
        }
        else {
          p._4_4_ = archive_mstring_get_mbs(&a->archive,&pmStack_38->pattern,(char **)&p_1);
          if ((p._4_4_ < L'\0') && (piVar2 = __errno_location(), *piVar2 == 0xc)) {
            wVar1 = error_nomem((archive_match *)list_local);
            return wVar1;
          }
          if (p_1 == (wchar_t *)0x0) {
            p_1 = L"";
          }
          m->next = (match *)p_1;
        }
        pmStack_20->unmatched_next = pmStack_38->next;
        if (pmStack_20->unmatched_next == (match *)0x0) {
          pmStack_20->unmatched_eof = L'\x01';
        }
        return L'\0';
      }
    }
    list->unmatched_next = (match *)0x0;
  }
  else {
    list->unmatched_eof = L'\0';
  }
  return L'\x01';
}

Assistant:

static int
match_list_unmatched_inclusions_next(struct archive_match *a,
    struct match_list *list, int mbs, const void **vp)
{
	struct match *m;

	*vp = NULL;
	if (list->unmatched_eof) {
		list->unmatched_eof = 0;
		return (ARCHIVE_EOF);
	}
	if (list->unmatched_next == NULL) {
		if (list->unmatched_count == 0)
			return (ARCHIVE_EOF);
		list->unmatched_next = list->first;
	}

	for (m = list->unmatched_next; m != NULL; m = m->next) {
		int r;

		if (m->matches)
			continue;
		if (mbs) {
			const char *p;
			r = archive_mstring_get_mbs(&(a->archive),
				&(m->pattern), &p);
			if (r < 0 && errno == ENOMEM)
				return (error_nomem(a));
			if (p == NULL)
				p = "";
			*vp = p;
		} else {
			const wchar_t *p;
			r = archive_mstring_get_wcs(&(a->archive),
				&(m->pattern), &p);
			if (r < 0 && errno == ENOMEM)
				return (error_nomem(a));
			if (p == NULL)
				p = L"";
			*vp = p;
		}
		list->unmatched_next = m->next;
		if (list->unmatched_next == NULL)
			/* To return EOF next time. */
			list->unmatched_eof = 1;
		return (ARCHIVE_OK);
	}
	list->unmatched_next = NULL;
	return (ARCHIVE_EOF);
}